

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::cliquePartition
          (HighsCliqueTable *this,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clqVars
          ,vector<int,_std::allocator<int>_> *partitionStart)

{
  CliqueVar *pCVar1;
  pointer piVar2;
  iterator iVar3;
  int iVar4;
  HighsInt HVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  HighsInt numClqVars;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  int local_50;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  pCVar1 = (clqVars->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
            (&this->randgen,pCVar1,
             (HighsInt)
             ((ulong)((long)(clqVars->
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) >> 2));
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&local_48,
             (long)(clqVars->
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(clqVars->
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 2);
  uVar8 = (long)(clqVars->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(clqVars->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_start >> 2;
  iVar7 = (int)uVar8;
  piVar2 = (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  local_4c = iVar7;
  std::vector<int,_std::allocator<int>_>::reserve(partitionStart,uVar8);
  local_50 = 0;
  iVar3._M_current =
       (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(partitionStart,iVar3,&local_50);
  }
  else {
    *iVar3._M_current = 0;
    (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  local_50 = 0;
  if (0 < iVar7) {
    uVar8 = uVar8 & 0xffffffff;
    do {
      iVar4 = (int)uVar8;
      if (local_50 == iVar4) {
        iVar3._M_current =
             (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)partitionStart,iVar3,&local_50);
          iVar4 = iVar7;
        }
        else {
          *iVar3._M_current = iVar4;
          (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          iVar4 = iVar7;
        }
      }
      pCVar1 = (clqVars->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_start + local_50;
      iVar6 = local_50 + 1;
      HVar5 = partitionNeighbourhood
                        (this,&local_48,&this->numNeighbourhoodQueries,*pCVar1,pCVar1 + 1,
                         iVar4 - iVar6);
      uVar8 = (ulong)(uint)(HVar5 + iVar6);
      local_50 = local_50 + 1;
    } while (local_50 < iVar7);
  }
  iVar3._M_current =
       (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)partitionStart,iVar3,&local_4c);
  }
  else {
    *iVar3._M_current = iVar7;
    (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsCliqueTable::cliquePartition(std::vector<CliqueVar>& clqVars,
                                       std::vector<HighsInt>& partitionStart) {
  randgen.shuffle(clqVars.data(), clqVars.size());

  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(clqVars.size());

  HighsInt numClqVars = clqVars.size();
  partitionStart.clear();
  partitionStart.reserve(clqVars.size());
  HighsInt extensionEnd = numClqVars;
  partitionStart.push_back(0);
  for (HighsInt i = 0; i < numClqVars; ++i) {
    if (i == extensionEnd) {
      partitionStart.push_back(i);
      extensionEnd = numClqVars;
    }
    CliqueVar v = clqVars[i];
    HighsInt extensionStart = i + 1;
    extensionEnd =
        partitionNeighbourhood(neighbourhoodInds, numNeighbourhoodQueries, v,
                               clqVars.data() + extensionStart,
                               extensionEnd - extensionStart) +
        extensionStart;
  }

  partitionStart.push_back(numClqVars);
}